

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress.cpp
# Opt level: O1

void __thiscall Al::internal::ProgressEngine::engine(ProgressEngine *this)

{
  InputQueue *pIVar1;
  _Hash_node_base *p_Var2;
  __int_type_conflict _Var3;
  void *pvVar4;
  iterator iVar5;
  ProgressEngine *pPVar6;
  InputQueue *pIVar7;
  int iVar8;
  size_type sVar9;
  mapped_type *pmVar10;
  vector<Al::internal::AlState*,std::allocator<Al::internal::AlState*>> *this_00;
  _Hash_node_base *p_Var11;
  socklen_t in_ECX;
  sockaddr *in_RDX;
  _Hash_node_base *p_Var12;
  int in_ESI;
  _Hash_node_base *p_Var13;
  __int_type_conflict _Var14;
  long lVar15;
  _Hashtable<void_*,_std::pair<void_*const,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>_>,_std::allocator<std::pair<void_*const,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this_01;
  bool bVar16;
  undefined1 auVar17 [16];
  AlState *req;
  unique_lock<std::mutex> lock;
  AlState *local_d0;
  _Hash_node_base *local_c8;
  key_type local_c0;
  unique_lock<std::mutex> local_b8;
  undefined8 auStack_a8 [4];
  _Hashtable<void_*,_std::pair<void_*const,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>_>,_std::allocator<std::pair<void_*const,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_88;
  ProgressEngine *local_80;
  InputQueue *local_78;
  string local_70;
  string local_50;
  
  bind(this,in_ESI,in_RDX,in_ECX);
  local_b8._M_device = &this->startup_mutex;
  local_b8._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_b8);
  local_b8._M_owns = true;
  LOCK();
  (this->started_flag)._M_base._M_i = true;
  UNLOCK();
  std::unique_lock<std::mutex>::~unique_lock(&local_b8);
  std::condition_variable::notify_all();
  if (((this->stop_flag)._M_base._M_i & 1U) == 0) {
    local_78 = this->request_queues;
    local_88 = &(this->run_queues)._M_h;
    local_80 = this;
    do {
      pIVar7 = local_78;
      pPVar6 = local_80;
      p_Var11 = (_Hash_node_base *)
                (local_80->num_input_streams).super___atomic_base<unsigned_long>._M_i;
      if (p_Var11 != (_Hash_node_base *)0x0) {
        _Var14 = 0;
        this_01 = local_88;
        local_c8 = p_Var11;
        do {
          pIVar1 = pIVar7 + _Var14;
          _Var3 = pIVar7[_Var14].q.front.super___atomic_base<unsigned_long>._M_i;
          if (pIVar7[_Var14].q.back.super___atomic_base<unsigned_long>._M_i == _Var3) {
            local_d0 = (AlState *)0x0;
          }
          else {
            local_d0 = (pIVar1->q).data[_Var3];
          }
          if (local_d0 != (AlState *)0x0) {
            iVar8 = (**(code **)(*(long *)local_d0 + 0x28))();
            if (iVar8 != 1) {
              if (iVar8 != 0) goto LAB_0010ae2b;
              if (3 < pPVar6->num_bounded) {
                local_b8._M_device = (mutex_type *)(**(code **)(*(long *)local_d0 + 0x20))();
                sVar9 = std::
                        _Hashtable<void_*,_std::pair<void_*const,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>_>,_std::allocator<std::pair<void_*const,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                        ::count(this_01,&local_b8._M_device);
                if (sVar9 != 0) {
                  local_c0 = (key_type)(**(code **)(*(long *)local_d0 + 0x20))();
                  pmVar10 = std::__detail::
                            _Map_base<void_*,_std::pair<void_*const,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>_>,_std::allocator<std::pair<void_*const,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            ::operator[]((_Map_base<void_*,_std::pair<void_*const,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>_>,_std::allocator<std::pair<void_*const,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                          *)this_01,&local_c0);
                  if (pmVar10->_M_elems[0].
                      super__Vector_base<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish !=
                      pmVar10->_M_elems[0].
                      super__Vector_base<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>
                      ._M_impl.super__Vector_impl_data._M_start) goto LAB_0010ae2b;
                }
              }
              pPVar6->num_bounded = pPVar6->num_bounded + 1;
            }
            local_b8._M_device = (mutex_type *)(**(code **)(*(long *)local_d0 + 0x20))();
            sVar9 = std::
                    _Hashtable<void_*,_std::pair<void_*const,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>_>,_std::allocator<std::pair<void_*const,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    ::count(this_01,&local_b8._M_device);
            if (sVar9 == 0) {
              local_c0 = (key_type)(**(code **)(*(long *)local_d0 + 0x20))();
              lVar15 = 0;
              do {
                *(undefined8 *)((long)auStack_a8 + lVar15 + -0x10) = 0;
                *(undefined8 *)((long)auStack_a8 + lVar15 + -8) = 0;
                *(undefined8 *)((long)auStack_a8 + lVar15) = 0;
                lVar15 = lVar15 + 0x18;
              } while (lVar15 != 0x30);
              std::
              _Hashtable<void*,std::pair<void*const,std::array<std::vector<Al::internal::AlState*,std::allocator<Al::internal::AlState*>>,2ul>>,std::allocator<std::pair<void*const,std::array<std::vector<Al::internal::AlState*,std::allocator<Al::internal::AlState*>>,2ul>>>,std::__detail::_Select1st,std::equal_to<void*>,std::hash<void*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              ::
              _M_emplace<void*,std::array<std::vector<Al::internal::AlState*,std::allocator<Al::internal::AlState*>>,2ul>>
                        ((_Hashtable<void*,std::pair<void*const,std::array<std::vector<Al::internal::AlState*,std::allocator<Al::internal::AlState*>>,2ul>>,std::allocator<std::pair<void*const,std::array<std::vector<Al::internal::AlState*,std::allocator<Al::internal::AlState*>>,2ul>>>,std::__detail::_Select1st,std::equal_to<void*>,std::hash<void*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                          *)this_01,&local_c0,&local_b8);
              lVar15 = 0x30;
              do {
                pvVar4 = *(void **)((long)&local_d0 + lVar15);
                if (pvVar4 != (void *)0x0) {
                  operator_delete(pvVar4,*(long *)((long)&local_c0 + lVar15) - (long)pvVar4);
                }
                lVar15 = lVar15 + -0x18;
                this_01 = local_88;
              } while (lVar15 != 0);
            }
            local_b8._M_device = (mutex_type *)(**(code **)(*(long *)local_d0 + 0x20))();
            this_00 = (vector<Al::internal::AlState*,std::allocator<Al::internal::AlState*>> *)
                      std::__detail::
                      _Map_base<void_*,_std::pair<void_*const,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>_>,_std::allocator<std::pair<void_*const,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<void_*,_std::pair<void_*const,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>_>,_std::allocator<std::pair<void_*const,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)this_01,&local_b8._M_device);
            iVar5._M_current = *(AlState ***)(this_00 + 8);
            if (iVar5._M_current == *(AlState ***)(this_00 + 0x10)) {
              std::vector<Al::internal::AlState*,std::allocator<Al::internal::AlState*>>::
              _M_realloc_insert<Al::internal::AlState*const&>(this_00,iVar5,&local_d0);
            }
            else {
              *iVar5._M_current = local_d0;
              *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
            }
            (**(code **)(*(long *)local_d0 + 0x10))();
            (pIVar1->q).front.super___atomic_base<unsigned_long>._M_i =
                 (pIVar1->q).size - 1 &
                 (pIVar1->q).front.super___atomic_base<unsigned_long>._M_i + 1;
            p_Var11 = local_c8;
          }
LAB_0010ae2b:
          _Var14 = _Var14 + 1;
        } while ((_Hash_node_base *)_Var14 != p_Var11);
      }
      p_Var11 = (pPVar6->run_queues)._M_h._M_before_begin._M_nxt;
      while (p_Var11 != (_Hash_node_base *)0x0) {
        lVar15 = 0;
        local_c8 = p_Var11;
        do {
          p_Var2 = p_Var11 + lVar15 * 3 + 2;
          p_Var12 = p_Var2->_M_nxt;
          if (p_Var12 != p_Var2[1]._M_nxt) {
            do {
              local_b8._M_device = (mutex_type *)p_Var12->_M_nxt;
              if (*(AlState *)((long)local_b8._M_device + 9) == (AlState)0x1) {
LAB_0010aea5:
                p_Var12 = p_Var12 + 1;
              }
              else {
                iVar8 = (**(code **)(*(long *)&((AlState *)local_b8._M_device)->field_0x0 + 0x18))()
                ;
                if (iVar8 != 2) {
                  if (iVar8 == 1) {
                    if (p_Var12 == p_Var2->_M_nxt) {
                      iVar5._M_current = (AlState **)p_Var11[lVar15 * 3 + 6]._M_nxt;
                      if ((_Hash_node_base *)iVar5._M_current == p_Var11[lVar15 * 3 + 7]._M_nxt) {
                        std::vector<Al::internal::AlState*,std::allocator<Al::internal::AlState*>>::
                        _M_realloc_insert<Al::internal::AlState*const&>
                                  ((vector<Al::internal::AlState*,std::allocator<Al::internal::AlState*>>
                                    *)(p_Var11 + lVar15 * 3 + 5),iVar5,(AlState **)&local_b8);
                      }
                      else {
                        *iVar5._M_current = (AlState *)local_b8._M_device;
                        p_Var11[lVar15 * 3 + 6]._M_nxt = p_Var11[lVar15 * 3 + 6]._M_nxt + 1;
                      }
                      goto LAB_0010aefe;
                    }
                    *(AlState *)((long)local_b8._M_device + 9) = (AlState)0x1;
                  }
                  else if (iVar8 != 0) {
                    auVar17 = __cxa_allocate_exception(0x70);
                    build_string<char_const(&)[17]>
                              (&local_50,(Al *)"Unknown PEAction",auVar17._8_8_);
                    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_70,
                               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Aluminum/src/progress.cpp"
                               ,"");
                    al_exception::al_exception(auVar17._0_8_,&local_50,&local_70,0x26d);
                    __cxa_throw(auVar17._0_8_,&al_exception::typeinfo,al_exception::~al_exception);
                  }
                  goto LAB_0010aea5;
                }
                iVar8 = (**(code **)(*(long *)local_b8._M_device + 0x28))();
                if (iVar8 == 0) {
                  local_80->num_bounded = local_80->num_bounded - 1;
                }
                if ((AlState *)local_b8._M_device != (AlState *)0x0) {
                  (**(code **)(*(long *)local_b8._M_device + 8))();
                }
LAB_0010aefe:
                p_Var13 = p_Var12 + 1;
                if (p_Var13 != p_Var2[1]._M_nxt) {
                  memmove(p_Var12,p_Var13,(long)p_Var2[1]._M_nxt - (long)p_Var13);
                }
                p_Var2[1]._M_nxt = p_Var2[1]._M_nxt + -1;
              }
            } while (p_Var12 != p_Var2[1]._M_nxt);
          }
          p_Var12 = p_Var2->_M_nxt;
          if (p_Var12 != p_Var2[1]._M_nxt) {
            p_Var13 = p_Var12 + 1;
            do {
              local_b8._M_device = (mutex_type *)p_Var12->_M_nxt;
              if (*(AlState *)((long)local_b8._M_device + 9) != (AlState)0x1) break;
              *(AlState *)((long)local_b8._M_device + 9) = (AlState)0x0;
              iVar5._M_current = (AlState **)p_Var11[lVar15 * 3 + 6]._M_nxt;
              if ((_Hash_node_base *)iVar5._M_current == p_Var11[lVar15 * 3 + 7]._M_nxt) {
                std::vector<Al::internal::AlState*,std::allocator<Al::internal::AlState*>>::
                _M_realloc_insert<Al::internal::AlState*const&>
                          ((vector<Al::internal::AlState*,std::allocator<Al::internal::AlState*>> *)
                           (p_Var11 + lVar15 * 3 + 5),iVar5,(AlState **)&local_b8);
              }
              else {
                *iVar5._M_current = (AlState *)local_b8._M_device;
                p_Var11[lVar15 * 3 + 6]._M_nxt = p_Var11[lVar15 * 3 + 6]._M_nxt + 1;
              }
              if (p_Var13 != p_Var2[1]._M_nxt) {
                memmove(p_Var12,p_Var13,(long)p_Var2[1]._M_nxt - (long)p_Var13);
              }
              p_Var2[1]._M_nxt = p_Var2[1]._M_nxt + -1;
            } while (p_Var12 != p_Var2[1]._M_nxt);
          }
          bVar16 = lVar15 == 0;
          lVar15 = lVar15 + 1;
        } while (bVar16);
        p_Var11 = local_c8->_M_nxt;
      }
    } while (((local_80->stop_flag)._M_base._M_i & 1U) == 0);
  }
  return;
}

Assistant:

void ProgressEngine::engine() {
#ifdef AL_HAS_CUDA
  // Set the current CUDA device for the thread.
  AL_CHECK_CUDA_NOSYNC(AlGpuSetDevice(cur_device.load()));
#endif
#ifdef AL_USE_HWLOC
  bind();
#endif
  // Notify the main thread we're now running.
  {
    std::unique_lock<std::mutex> lock(startup_mutex);
    started_flag = true;
  }
#ifdef AL_PE_START_ON_DEMAND
  startup_cv.notify_all();
#else
  startup_cv.notify_one();
#endif
  while (!stop_flag.load(std::memory_order_acquire)) {
    // Check for newly-submitted requests.
    size_t cur_input_streams = num_input_streams.load();
    for (size_t i = 0; i < cur_input_streams; ++i) {
      AlState* req = request_queues[i].q.peek();
      if (req != nullptr) {
        // Add to the correct run queue if one is available.
        bool do_start = false;
        switch (req->get_run_type()) {
        case RunType::bounded:
          // Move to the run queue if any of the following hold:
          //   1. num_bounded < AL_PE_NUM_CONCURRENT_OPS.
          //   2. The run_queue for this stream doesn't exist.
          //   3. The run_queue for this stream's first stage is empty.
          if (num_bounded < AL_PE_NUM_CONCURRENT_OPS
              || !run_queues.count(req->get_compute_stream())
              || !run_queues[req->get_compute_stream()][0].size()) {
            ++num_bounded;
            do_start = true;
          }
          break;
        case RunType::unbounded:
          do_start = true;
          break;
        }
        if (do_start) {
          // Add to end of first pipeline stage.
          // Create run queues if needed.
          if (!run_queues.count(req->get_compute_stream())) {
            run_queues.emplace(req->get_compute_stream(),
                               decltype(run_queues)::mapped_type{});
          }
          run_queues[req->get_compute_stream()][0].push_back(req);
          req->start();
#ifdef AL_DEBUG_HANG_CHECK
          req->start_time = get_time();
#endif
#ifdef AL_TRACE
          trace::record_pe_start(*req);
#endif
          request_queues[i].q.pop_always();
        }
      }
    }
    // Process one step of each in-progress request.
    for (auto&& stream_pipeline_pair : run_queues) {
      auto&& pipeline = stream_pipeline_pair.second;
      for (size_t stage = 0; stage < AL_PE_NUM_PIPELINE_STAGES; ++stage) {
        // Process this stage of the pipeline.
        for (auto i = pipeline[stage].begin(); i != pipeline[stage].end();) {
          AlState* req = *i;
          // Simply skip over paused states.
          if (req->paused_for_advance) {
            ++i;
          } else {
            PEAction action = req->step();
            switch (action) {
            case PEAction::cont:
              // Nothing to do here.
#ifdef AL_DEBUG_HANG_CHECK
              // Check whether we have hung.
              if (!req->hang_reported) {
                double t = get_time();
                if (t - req->start_time > 10.0 + world_comm->rank()) {
                  std::cout << world_comm->rank()
                            << ": Progress engine detected a possible hang"
                            << " state=" << req << " " << req->get_name()
                            << " compute_stream=" << req->get_compute_stream()
                            << " run_type="
                            << (req->get_run_type() == RunType::bounded ? "bounded" : "unbounded")
                            << std::endl;
                  req->hang_reported = true;
                }
              }
#endif
              ++i;
              break;
            case PEAction::advance:
#ifdef AL_DEBUG
              // Ensure we don't advance too far.
              if (stage + 1 >= AL_PE_NUM_PIPELINE_STAGES) {
                throw_al_exception("Trying to advance pipeline stage too far");
              }
#endif
              // Only move if this is the head of the pipeline stage.
              if (i == pipeline[stage].begin()) {
                pipeline[stage+1].push_back(req);
                i = pipeline[stage].erase(i);
              } else {
                req->paused_for_advance = true;
                ++i;
              }
              break;
            case PEAction::complete:
              if (req->get_run_type() == RunType::bounded) {
                --num_bounded;
              }
#ifdef AL_TRACE
              trace::record_pe_done(*req);
#endif
              delete req;
              i = pipeline[stage].erase(i);
              break;
            default:
              throw_al_exception("Unknown PEAction");
              break;
            }
          }
        }
        // Check whether we can advance paused states.
        for (auto i = pipeline[stage].begin(); i != pipeline[stage].end();) {
          AlState* req = *i;
          if (req->paused_for_advance) {
            // Move to the next stage.
            req->paused_for_advance = false;
            pipeline[stage+1].push_back(req);
            i = pipeline[stage].erase(i);
          } else {
            break;  // Nothing at the head to advance.
          }
        }
      }
    }
  }
}